

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float128 float32_to_float128_arm(float32 a,float_status *status)

{
  float32 a_00;
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  float128 fVar5;
  commonNaNT local_20;
  
  a_00 = float32_squash_input_denormal_arm(a,status);
  uVar4 = a_00 & 0x7fffff;
  uVar3 = (ulong)(a_00 >> 0x1f);
  if ((char)(a_00 >> 0x17) == '\0') {
    if (uVar4 == 0) {
      uVar3 = uVar3 << 0x3f;
      uVar1 = 0;
      goto LAB_00509c7b;
    }
    uVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar4 = uVar4 << ((char)(uVar2 ^ 0x1f) - 8U & 0x1f);
    uVar2 = 8 - (uVar2 ^ 0x1f);
LAB_00509c5f:
    uVar3 = ((ulong)(uVar2 + 0x3f80) << 0x30) + (uVar3 << 0x3f | (ulong)uVar4 << 0x19);
  }
  else {
    uVar2 = a_00 >> 0x17 & 0xff;
    if (uVar2 != 0xff) goto LAB_00509c5f;
    if (uVar4 == 0) {
      uVar3 = uVar3 << 0x3f | 0x7fff000000000000;
    }
    else {
      float32ToCommonNaN(&local_20,a_00,status);
      if (status->default_nan_mode == '\0') {
        uVar1 = local_20.low >> 0x10 | local_20.high << 0x30;
        uVar3 = (ulong)(uint)local_20._0_4_ << 0x3f | local_20.high >> 0x10 | 0x7fff000000000000;
        goto LAB_00509c7b;
      }
      uVar3 = 0x7fff800000000000;
    }
  }
  uVar1 = 0;
LAB_00509c7b:
  fVar5.high = uVar3;
  fVar5.low = uVar1;
  return fVar5;
}

Assistant:

float128 float32_to_float128(float32 a, float_status *status)
{
    flag aSign;
    int aExp;
    uint32_t aSig;

    a = float32_squash_input_denormal(a, status);
    aSig = extractFloat32Frac( a );
    aExp = extractFloat32Exp( a );
    aSign = extractFloat32Sign( a );
    if ( aExp == 0xFF ) {
        if (aSig) {
            return commonNaNToFloat128(float32ToCommonNaN(a, status), status);
        }
        return packFloat128( aSign, 0x7FFF, 0, 0 );
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloat128( aSign, 0, 0, 0 );
        normalizeFloat32Subnormal( aSig, &aExp, &aSig );
        --aExp;
    }
    return packFloat128( aSign, aExp + 0x3F80, ( (uint64_t) aSig )<<25, 0 );

}